

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

void __thiscall
TPZMatrix<double>::AddKel
          (TPZMatrix<double> *this,TPZFMatrix<double> *elmat,TPZVec<long> *source,
          TPZVec<long> *destinationindex)

{
  int iVar1;
  int64_t iVar2;
  long *plVar3;
  double *pdVar4;
  TPZVec<long> *in_RCX;
  TPZVec<long> *in_RDX;
  long *in_RDI;
  double prevval;
  int64_t jeqs;
  int64_t ieqs;
  int64_t jeq;
  int64_t ieq;
  int64_t jcoef;
  int64_t icoef;
  int64_t nelem;
  double local_60;
  long local_58;
  long lVar5;
  long lVar6;
  TPZFMatrix<double> *pTVar7;
  long local_38;
  long local_30;
  
  iVar2 = TPZVec<long>::NElements(in_RDX);
  iVar1 = (**(code **)(*in_RDI + 0x80))();
  if (iVar1 == 0) {
    for (local_30 = 0; local_30 < iVar2; local_30 = local_30 + 1) {
      plVar3 = TPZVec<long>::operator[](in_RCX,local_30);
      pTVar7 = (TPZFMatrix<double> *)*plVar3;
      plVar3 = TPZVec<long>::operator[](in_RDX,local_30);
      lVar5 = *plVar3;
      for (local_38 = 0; local_38 < iVar2; local_38 = local_38 + 1) {
        plVar3 = TPZVec<long>::operator[](in_RCX,local_38);
        lVar6 = *plVar3;
        plVar3 = TPZVec<long>::operator[](in_RDX,local_38);
        local_58 = *plVar3;
        local_60 = (double)(**(code **)(*in_RDI + 0x120))(in_RDI,pTVar7,lVar6);
        pdVar4 = TPZFMatrix<double>::operator()(pTVar7,lVar6,lVar5);
        local_60 = *pdVar4 + local_60;
        (**(code **)(*in_RDI + 0x118))(in_RDI,pTVar7,lVar6,&local_60);
      }
    }
  }
  else {
    for (local_30 = 0; local_30 < iVar2; local_30 = local_30 + 1) {
      plVar3 = TPZVec<long>::operator[](in_RCX,local_30);
      pTVar7 = (TPZFMatrix<double> *)*plVar3;
      plVar3 = TPZVec<long>::operator[](in_RDX,local_30);
      lVar5 = *plVar3;
      for (local_38 = local_30; local_38 < iVar2; local_38 = local_38 + 1) {
        plVar3 = TPZVec<long>::operator[](in_RCX,local_38);
        lVar6 = *plVar3;
        plVar3 = TPZVec<long>::operator[](in_RDX,local_38);
        local_58 = *plVar3;
        local_60 = (double)(**(code **)(*in_RDI + 0x120))(in_RDI,pTVar7,lVar6);
        pdVar4 = TPZFMatrix<double>::operator()(pTVar7,lVar6,lVar5);
        local_60 = *pdVar4 + local_60;
        (**(code **)(*in_RDI + 0x118))(in_RDI,pTVar7,lVar6,&local_60);
      }
    }
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::AddKel(TPZFMatrix<TVar> &elmat, TPZVec<int64_t> &source, TPZVec<int64_t> &destinationindex) {
	
	int64_t nelem = source.NElements();
  	int64_t icoef,jcoef,ieq,jeq,ieqs,jeqs;
    TVar prevval;
	if(IsSymmetric()) {
		for(icoef=0; icoef<nelem; icoef++) {
			ieq = destinationindex[icoef];
			ieqs = source[icoef];
			for(jcoef=icoef; jcoef<nelem; jcoef++) {
				jeq = destinationindex[jcoef];
				jeqs = source[jcoef];
				prevval = GetVal(ieq,jeq);
				prevval += elmat(ieqs,jeqs);
				PutVal(ieq,jeq,prevval);
			}
		}
	} else {
		for(icoef=0; icoef<nelem; icoef++) {
			ieq = destinationindex[icoef];
			ieqs = source[icoef];
			for(jcoef=0; jcoef<nelem; jcoef++) {
				jeq = destinationindex[jcoef];
				jeqs = source[jcoef];
				prevval = GetVal(ieq,jeq);
				prevval += elmat(ieqs,jeqs);
				PutVal(ieq,jeq,prevval);
			}
		}
	}
}